

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LateCallDescriptor.cpp
# Opt level: O1

int __thiscall
ninx::parser::util::LateCallDescriptor::clone
          (LateCallDescriptor *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Block *pBVar1;
  Block *pBVar2;
  _func_int **in_RAX;
  _Head_base<0UL,_ninx::parser::element::Block_*,_false> _Var3;
  pointer *__ptr;
  _func_int **local_18;
  
  local_18 = in_RAX;
  element::ASTElement::clone<ninx::parser::element::Block>((ASTElement *)&local_18);
  _Var3._M_head_impl = (Block *)operator_new(0x18);
  pBVar1 = *(Block **)(__fn + 8);
  pBVar2 = *(Block **)(__fn + 0x10);
  *(_func_int ***)&(_Var3._M_head_impl)->super_Expression = local_18;
  *(Block **)((long)&(_Var3._M_head_impl)->super_Expression + 8) = pBVar1;
  *(Block **)((long)&(_Var3._M_head_impl)->super_Expression + 0x10) = pBVar2;
  (this->body)._M_t.
  super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  ._M_t.
  super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
  .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl = _Var3._M_head_impl;
  return (int)this;
}

Assistant:

std::unique_ptr<ninx::parser::util::LateCallDescriptor> ninx::parser::util::LateCallDescriptor::clone() {
    return std::make_unique<LateCallDescriptor>(body->clone<ninx::parser::element::Block>(), function, target_object);
}